

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

char * nivalis::OpCode::repr(uint32_t opcode)

{
  uint32_t opcode_local;
  char *local_8;
  
  if (opcode == 0) {
    local_8 = "nan";
  }
  else if (opcode == 1) {
    local_8 = "\v";
  }
  else if (opcode == 2) {
    local_8 = "\r";
  }
  else if (opcode == 3) {
    local_8 = "$";
  }
  else if (opcode == 8) {
    local_8 = "@@";
  }
  else if (opcode == 9) {
    local_8 = "";
  }
  else if (opcode == 0xc) {
    local_8 = "\t(@)";
  }
  else if (opcode == 0x10) {
    local_8 = "{@: @, @}";
  }
  else if (opcode == 0x11) {
    local_8 = "sum(\r, @, @)[@]";
  }
  else if (opcode == 0x12) {
    local_8 = "prod(\r, @, @)[@]";
  }
  else if (opcode == 0x18) {
    local_8 = "{0: @, @}";
  }
  else if (opcode == 0x20) {
    local_8 = "(@ + @)";
  }
  else if (opcode == 0x21) {
    local_8 = "(@ - @)";
  }
  else if (opcode == 0x30) {
    local_8 = "(@ * @)";
  }
  else if (opcode == 0x31) {
    local_8 = "(@ / @)";
  }
  else if (opcode == 0x32) {
    local_8 = "(@ % @)";
  }
  else if (opcode == 0x40) {
    local_8 = "(@ ^ @)";
  }
  else if (opcode == 0x41) {
    local_8 = "log(@, @)";
  }
  else if (opcode == 0x50) {
    local_8 = "max(@, @)";
  }
  else if (opcode == 0x51) {
    local_8 = "min(@, @)";
  }
  else if (opcode == 0x52) {
    local_8 = "(@ & @)";
  }
  else if (opcode == 0x53) {
    local_8 = "(@ | @)";
  }
  else if (opcode == 0x54) {
    local_8 = "xor(@, @)";
  }
  else if (opcode == 0x60) {
    local_8 = "(@ < @)";
  }
  else if (opcode == 0x61) {
    local_8 = "(@ <= @)";
  }
  else if (opcode == 0x62) {
    local_8 = "(@ == @)";
  }
  else if (opcode == 99) {
    local_8 = "(@ != @)";
  }
  else if (opcode == 100) {
    local_8 = "(@ >= @)";
  }
  else if (opcode == 0x65) {
    local_8 = "(@ > @)";
  }
  else if (opcode == 0x4000) {
    local_8 = "gcd(@, @)";
  }
  else if (opcode == 0x4001) {
    local_8 = "lcm(@, @)";
  }
  else if (opcode == 0x4002) {
    local_8 = "choose(@, @)";
  }
  else if (opcode == 0x4003) {
    local_8 = "fafact(@, @)";
  }
  else if (opcode == 0x4004) {
    local_8 = "rifact(@, @)";
  }
  else if (opcode == 0x4005) {
    local_8 = "beta(@, @)";
  }
  else if (opcode == 0x4006) {
    local_8 = "polygamma(@, @)";
  }
  else if (opcode == 0x8000) {
    local_8 = "(-@)";
  }
  else if (opcode == 0x8001) {
    local_8 = "not(@)";
  }
  else if (opcode == 0x8002) {
    local_8 = "abs(@)";
  }
  else if (opcode == 0x8003) {
    local_8 = "sqrt(@)";
  }
  else if (opcode == 0x8004) {
    local_8 = "@^2";
  }
  else if (opcode == 0x8005) {
    local_8 = "sgn(@)";
  }
  else if (opcode == 0x8006) {
    local_8 = "floor(@)";
  }
  else if (opcode == 0x8007) {
    local_8 = "ceil(@)";
  }
  else if (opcode == 0x8008) {
    local_8 = "round(@)";
  }
  else if (opcode == 0x8009) {
    local_8 = "exp(@)";
  }
  else if (opcode == 0x800a) {
    local_8 = "exp2(@)";
  }
  else if (opcode == 0x800b) {
    local_8 = "ln(@)";
  }
  else if (opcode == 0x800c) {
    local_8 = "log10(@)";
  }
  else if (opcode == 0x800d) {
    local_8 = "log2(@)";
  }
  else if (opcode == 0x800e) {
    local_8 = "fact(@)";
  }
  else if (opcode == 0x800f) {
    local_8 = "sin(@)";
  }
  else if (opcode == 0x8010) {
    local_8 = "cos(@)";
  }
  else if (opcode == 0x8011) {
    local_8 = "tan(@)";
  }
  else if (opcode == 0x8012) {
    local_8 = "arcsin(@)";
  }
  else if (opcode == 0x8013) {
    local_8 = "arccos(@)";
  }
  else if (opcode == 0x8014) {
    local_8 = "arctan(@)";
  }
  else if (opcode == 0x8015) {
    local_8 = "sinh(@)";
  }
  else if (opcode == 0x8016) {
    local_8 = "cosh(@)";
  }
  else if (opcode == 0x8017) {
    local_8 = "tanh(@)";
  }
  else if (opcode == 0x8018) {
    local_8 = "gamma(@)";
  }
  else if (opcode == 0x8019) {
    local_8 = "lgamma(@)";
  }
  else if (opcode == 0x801a) {
    local_8 = "digamma(@)";
  }
  else if (opcode == 0x801b) {
    local_8 = "trigamma(@)";
  }
  else if (opcode == 0x801c) {
    local_8 = "erf(@)";
  }
  else if (opcode == 0x801d) {
    local_8 = "zeta(@)";
  }
  else if (opcode == 0x801e) {
    local_8 = "sigmoid(@)";
  }
  else if (opcode == 0x801f) {
    local_8 = "softplus(@)";
  }
  else if (opcode == 0x8020) {
    local_8 = "gausspdf(@)";
  }
  else {
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char* repr(uint32_t opcode) {
    using namespace OpCode;
    switch (opcode) {
        case OpCode::null:  return "nan";
        case val:   return "\v";
        case ref:   return "\r";
        case sums:     return "sum(\r, @, @)[@]";
        case prods:    return "prod(\r, @, @)[@]";
        case bnz:   return "{@: @, @}";
        case bsel:  return "{0: @, @}";
        case add:   return "(@ + @)";
        case sub:   return "(@ - @)";
        case mul:   return "(@ * @)";
        case divi:   return "(@ / @)";
        case mod:   return "(@ % @)";
        case power: return "(@ ^ @)";
        case logbase:  return "log(@, @)";
        case max:   return "max(@, @)";
        case min:   return "min(@, @)";
        case land:  return "(@ & @)";
        case lor:   return "(@ | @)";
        case lxor:  return "xor(@, @)";
        case lt:    return "(@ < @)";
        case le:    return "(@ <= @)";
        case eq:    return "(@ == @)";
        case ne:    return "(@ != @)";
        case ge:    return "(@ >= @)";
        case gt:    return "(@ > @)";
        case gcd:   return "gcd(@, @)";
        case lcm:   return "lcm(@, @)";
        case choose:    return "choose(@, @)";
        case fafact:    return "fafact(@, @)";
        case rifact:    return "rifact(@, @)";
        case betab:      return "beta(@, @)";
        case polygammab: return "polygamma(@, @)";
        case unaryminus:   return "(-@)";
        case lnot:     return "not(@)";
        case absb:      return "abs(@)";
        case sqrtb:     return "sqrt(@)";
        case sqrb:      return "@^2";
        case sgn:      return "sgn(@)";
        case floorb:    return "floor(@)";
        case ceilb:     return "ceil(@)";
        case roundb:    return "round(@)";
        case expb:      return "exp(@)";
        case exp2b:     return "exp2(@)";
        case logb:      return "ln(@)";
        case log10b:    return "log10(@)";
        case log2b:     return "log2(@)";
        case factb:     return "fact(@)";
        case sinb:      return "sin(@)";
        case cosb:      return "cos(@)";
        case tanb:      return "tan(@)";
        case asinb:     return "arcsin(@)";
        case acosb:     return "arccos(@)";
        case atanb:     return "arctan(@)";
        case sinhb:     return "sinh(@)";
        case coshb:     return "cosh(@)";
        case tanhb:     return "tanh(@)";
        case tgammab:    return "gamma(@)";
        case lgammab:   return "lgamma(@)";
        case digammab:  return "digamma(@)";
        case trigammab: return "trigamma(@)";
        case erfb:      return "erf(@)";
        case zetab:     return "zeta(@)";
        case sigmoidb:     return "sigmoid(@)";
        case softplusb:     return "softplus(@)";
        case gausspdfb:     return "gausspdf(@)";
        case thunk_jmp: return "";
        case thunk_ret: return "@@";
        case arg: return "$";
        case call: return "\t(@)";
        default: return "";
    };
}